

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

Optional<llbuild::buildsystem::BuildValue> * __thiscall
anon_unknown.dwarf_60e82::BuildSystemImpl::build
          (Optional<llbuild::buildsystem::BuildValue> *__return_storage_ptr__,BuildSystemImpl *this,
          BuildKey *key)

{
  int iVar1;
  ValueType *__x;
  StringRef filename;
  BuildValue local_f8;
  undefined4 local_84;
  KeyType local_80;
  undefined1 local_60 [8];
  ValueType result;
  BuildKey *key_local;
  BuildSystemImpl *this_local;
  
  iVar1 = llbuild::basic::sys::raiseOpenFileLimit(0x800);
  if (iVar1 == 0) {
    this->buildWasAborted = false;
    llbuild::buildsystem::BuildKey::toData(&local_80,key);
    __x = llbuild::core::BuildEngine::build(&this->buildEngine,&local_80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,__x);
    llbuild::core::KeyType::~KeyType(&local_80);
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
    ::clear(&this->shellHandlers);
    if ((this->buildWasAborted & 1U) == 0) {
      llbuild::buildsystem::BuildValue::fromData(&local_f8,(ValueType *)local_60);
      llvm::Optional<llbuild::buildsystem::BuildValue>::Optional(__return_storage_ptr__,&local_f8);
      llbuild::buildsystem::BuildValue::~BuildValue(&local_f8);
    }
    else {
      llvm::Optional<llbuild::buildsystem::BuildValue>::Optional(__return_storage_ptr__,None);
    }
    local_84 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  }
  else {
    filename = getMainFilename(this);
    llvm::Twine::Twine((Twine *)&result.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "failed to raise open file limit");
    error(this,filename,
          (Twine *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
    llvm::Optional<llbuild::buildsystem::BuildValue>::Optional(__return_storage_ptr__,None);
  }
  return __return_storage_ptr__;
}

Assistant:

llvm::Optional<BuildValue> BuildSystemImpl::build(BuildKey key) {

  if (basic::sys::raiseOpenFileLimit() != 0) {
    error(getMainFilename(), "failed to raise open file limit");
    return None;
  }

  // Build the target.
  buildWasAborted = false;
  auto result = buildEngine.build(key.toData());
    
  // Clear out the shell handlers, as we do not want to hold on to them across
  // multiple builds.
  shellHandlers.clear();

  if (buildWasAborted)
    return None;
  return BuildValue::fromData(result);
}